

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWRepository.cxx
# Opt level: O0

void __thiscall
cmCPackIFWRepository::WriteRepositoryUpdates(cmCPackIFWRepository *this,cmXMLWriter *xout)

{
  cmXMLWriter *this_00;
  bool bVar1;
  reference ppcVar2;
  cmCPackIFWRepository *r;
  iterator __end2;
  iterator __begin2;
  RepositoriesVector *__range2;
  allocator<char> local_39;
  string local_38;
  cmXMLWriter *local_18;
  cmXMLWriter *xout_local;
  cmCPackIFWRepository *this_local;
  
  local_18 = xout;
  xout_local = (cmXMLWriter *)this;
  bVar1 = std::vector<cmCPackIFWRepository_*,_std::allocator<cmCPackIFWRepository_*>_>::empty
                    (&this->RepositoryUpdate);
  this_00 = local_18;
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"RepositoryUpdate",&local_39);
    cmXMLWriter::StartElement(this_00,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator(&local_39);
    __end2 = std::vector<cmCPackIFWRepository_*,_std::allocator<cmCPackIFWRepository_*>_>::begin
                       (&this->RepositoryUpdate);
    r = (cmCPackIFWRepository *)
        std::vector<cmCPackIFWRepository_*,_std::allocator<cmCPackIFWRepository_*>_>::end
                  (&this->RepositoryUpdate);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<cmCPackIFWRepository_**,_std::vector<cmCPackIFWRepository_*,_std::allocator<cmCPackIFWRepository_*>_>_>
                                  *)&r);
      if (!bVar1) break;
      ppcVar2 = __gnu_cxx::
                __normal_iterator<cmCPackIFWRepository_**,_std::vector<cmCPackIFWRepository_*,_std::allocator<cmCPackIFWRepository_*>_>_>
                ::operator*(&__end2);
      WriteRepositoryUpdate(*ppcVar2,local_18);
      __gnu_cxx::
      __normal_iterator<cmCPackIFWRepository_**,_std::vector<cmCPackIFWRepository_*,_std::allocator<cmCPackIFWRepository_*>_>_>
      ::operator++(&__end2);
    }
    cmXMLWriter::EndElement(local_18);
  }
  return;
}

Assistant:

void cmCPackIFWRepository::WriteRepositoryUpdates(cmXMLWriter& xout)
{
  if (!this->RepositoryUpdate.empty()) {
    xout.StartElement("RepositoryUpdate");
    for (cmCPackIFWRepository* r : this->RepositoryUpdate) {
      r->WriteRepositoryUpdate(xout);
    }
    xout.EndElement();
  }
}